

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::Channel_const&,std::chrono::duration<long,std::ratio<1l,1000l>>)>
          (Action<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Result local_58;
  ArgumentTuple local_30;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_30.
  super__Tuple_impl<0UL,_const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  .super__Tuple_impl<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
  super__Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>._M_head_impl.__r
       = (_Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>)
         (args->
         super__Tuple_impl<0UL,_const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
         ).super__Tuple_impl<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
         super__Head_base<1UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>.
         _M_head_impl.__r;
  local_30.
  super__Tuple_impl<0UL,_const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  .super__Head_base<0UL,_const_ot::commissioner::Channel_&,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
       ).super__Head_base<0UL,_const_ot::commissioner::Channel_&,_false>._M_head_impl;
  Action<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  ::Perform(&local_58,action,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p == &local_58.mMessage.field_2) {
    local_68._8_8_ = local_58.mMessage.field_2._8_8_;
    local_78 = &local_68;
  }
  else {
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_58.mMessage._M_dataplus._M_p;
  }
  local_68._M_allocated_capacity._1_7_ = local_58.mMessage.field_2._M_allocated_capacity._1_7_;
  local_68._M_local_buf[0] = local_58.mMessage.field_2._M_local_buf[0];
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_002e1908;
  (pAVar1->result_).value_.mCode = local_58.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_78 == &local_68) {
    paVar2->_M_allocated_capacity = local_68._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = local_68._8_8_;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)local_78;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity = local_68._M_allocated_capacity
    ;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_58.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }